

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VtabModuleUnref(sqlite3 *db,Module *pMod)

{
  sqlite3 *in_RSI;
  void *in_stack_ffffffffffffffe8;
  
  *(int *)&in_RSI->pDfltColl = *(int *)&in_RSI->pDfltColl + -1;
  if (*(int *)&in_RSI->pDfltColl == 0) {
    if (in_RSI->aDb != (Db *)0x0) {
      (*(code *)in_RSI->aDb)(in_RSI->mutex);
    }
    sqlite3DbFree(in_RSI,in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VtabModuleUnref(sqlite3 *db, Module *pMod){
  assert( pMod->nRefModule>0 );
  pMod->nRefModule--;
  if( pMod->nRefModule==0 ){
    if( pMod->xDestroy ){
      pMod->xDestroy(pMod->pAux);
    }
    assert( pMod->pEpoTab==0 );
    sqlite3DbFree(db, pMod);
  }
}